

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O2

size_t absl::lts_20250127::log_internal::FormatLogPrefix
                 (LogSeverity severity,Time timestamp,Tid tid,string_view basename,int line,
                 PrefixFormat format,Span<char> *buf)

{
  pointer pcVar1;
  uint uVar2;
  TimeZone *this;
  char *pcVar3;
  int64_t iVar4;
  Nonnull<char_*> pcVar5;
  size_t sVar6;
  Nonnull<char_*> pcVar7;
  Span<char> *dst;
  undefined4 in_register_0000000c;
  undefined8 extraout_RDX;
  char *pcVar8;
  timeval tVar9;
  string_view src;
  string_view src_00;
  Duration d;
  Tid local_6c;
  int local_68;
  int local_64;
  CivilInfo ci;
  
  dst = (Span<char> *)CONCAT44(in_register_0000000c,tid);
  if (buf->len_ < 0x22) {
    Span<char>::remove_suffix(buf,buf->len_);
    pcVar5 = (Nonnull<char_*>)0x0;
    goto LAB_00d04e02;
  }
  this = TimeZone();
  if (this == (TimeZone *)0x0) {
    tVar9 = ToTimeval(timestamp);
    pcVar5 = buf->ptr_;
    sVar6 = buf->len_;
    ci.cs.f_.y = (int_least64_t)anon_var_dwarf_4806527;
    ci.cs.f_.m = '\x1b';
    ci.cs.f_.d = '\0';
    ci.cs.f_.hh = '\0';
    ci.cs.f_.mm = '\0';
    ci.cs.f_.ss = '\0';
    ci.cs.f_._13_3_ = 0;
    dst = (Span<char> *)LogSeverityName(severity);
    local_64 = (int)tVar9.tv_sec;
    local_68 = (int)tVar9.tv_usec;
    local_6c = tid;
    uVar2 = SNPrintF<char,_int,_int,_int>
                      (pcVar5,sVar6,(FormatSpec<char,_int,_int,_int> *)&ci,(char *)dst,&local_64,
                       &local_68,&local_6c);
    if ((int)uVar2 < 0) {
      pcVar5 = (Nonnull<char_*>)0x0;
    }
    else {
      pcVar5 = (Nonnull<char_*>)(ulong)uVar2;
      Span<char>::remove_prefix(buf,(size_type)pcVar5);
    }
    goto LAB_00d04e02;
  }
  pcVar8 = buf->ptr_;
  pcVar3 = LogSeverityName(severity);
  *pcVar8 = *pcVar3;
  lts_20250127::TimeZone::At(&ci,this,timestamp);
  numbers_internal::PutTwoDigits((int)ci.cs.f_.m,pcVar8 + 1);
  numbers_internal::PutTwoDigits((int)ci.cs.f_.d,pcVar8 + 3);
  pcVar8[5] = ' ';
  numbers_internal::PutTwoDigits((int)ci.cs.f_.hh,pcVar8 + 6);
  pcVar8[8] = ':';
  numbers_internal::PutTwoDigits((int)ci.cs.f_.mm,pcVar8 + 9);
  pcVar8[0xb] = ':';
  numbers_internal::PutTwoDigits((int)ci.cs.f_.ss,pcVar8 + 0xc);
  pcVar8[0xe] = '.';
  d.rep_hi_.hi_ = 0;
  d.rep_hi_.lo_ = ci.subsecond.rep_lo_;
  d.rep_lo_ = (uint32_t)extraout_RDX;
  iVar4 = ToInt64Microseconds((lts_20250127 *)ci.subsecond.rep_hi_,d);
  numbers_internal::PutTwoDigits((uint32_t)(iVar4 / 10000),pcVar8 + 0xf);
  dst = (Span<char> *)&DAT_00000064;
  numbers_internal::PutTwoDigits((uint32_t)((iVar4 / 100) % 100),pcVar8 + 0x11);
  numbers_internal::PutTwoDigits((uint32_t)(iVar4 % 100),pcVar8 + 0x13);
  pcVar8[0x15] = ' ';
  if ((uint)tid < 10) {
    pcVar8[0x16] = ' ';
    pcVar8 = pcVar8 + 0x17;
LAB_00d04daf:
    *pcVar8 = ' ';
    pcVar8 = pcVar8 + 1;
LAB_00d04db7:
    *pcVar8 = ' ';
    pcVar8 = pcVar8 + 1;
LAB_00d04dbf:
    *pcVar8 = ' ';
    pcVar8 = pcVar8 + 1;
LAB_00d04dc7:
    *pcVar8 = ' ';
    pcVar8 = pcVar8 + 1;
LAB_00d04dcf:
    *pcVar8 = ' ';
    pcVar8 = pcVar8 + 1;
  }
  else {
    pcVar8 = pcVar8 + 0x16;
    if (tid + 9U < 0x6d) goto LAB_00d04daf;
    if (tid + 99U < 1099) goto LAB_00d04db7;
    if (tid + 999U < 10999) goto LAB_00d04dbf;
    if (tid + 9999U < 109999) goto LAB_00d04dc7;
    if (tid + 99999U < 1099999) goto LAB_00d04dcf;
  }
  pcVar5 = numbers_internal::FastIntToBuffer(tid,pcVar8);
  *pcVar5 = ' ';
  pcVar5 = pcVar5 + (1 - (long)buf->ptr_);
  Span<char>::remove_prefix(buf,(size_type)pcVar5);
LAB_00d04e02:
  src._M_str = (char *)buf;
  src._M_len = (size_t)basename._M_str;
  sVar6 = AppendTruncated((log_internal *)basename._M_len,src,dst);
  if (buf->len_ < 0xe) {
    Span<char>::remove_suffix(buf,buf->len_);
    pcVar7 = (Nonnull<char_*>)0x0;
  }
  else {
    pcVar1 = buf->ptr_;
    *pcVar1 = ':';
    pcVar7 = numbers_internal::FastIntToBuffer(line,pcVar1 + 1);
    pcVar7[0] = ']';
    pcVar7[1] = ' ';
    pcVar7 = pcVar7 + (2 - (long)buf->ptr_);
    Span<char>::remove_prefix(buf,(size_type)pcVar7);
  }
  pcVar7 = pcVar5 + sVar6 + (long)pcVar7;
  if (format == kRaw) {
    src_00._M_str = (char *)buf;
    src_00._M_len = (size_t)"RAW: ";
    sVar6 = AppendTruncated((log_internal *)&DAT_00000005,src_00,dst);
    pcVar7 = pcVar7 + sVar6;
  }
  return (size_t)pcVar7;
}

Assistant:

size_t FormatLogPrefix(absl::LogSeverity severity, absl::Time timestamp,
                       log_internal::Tid tid, absl::string_view basename,
                       int line, PrefixFormat format, absl::Span<char>& buf) {
  auto prefix_size = FormatBoundedFields(severity, timestamp, tid, buf);
  prefix_size += log_internal::AppendTruncated(basename, buf);
  prefix_size += FormatLineNumber(line, buf);
  if (format == PrefixFormat::kRaw)
    prefix_size += log_internal::AppendTruncated("RAW: ", buf);
  return prefix_size;
}